

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

int getflag(int argc,char **argv,char *flags)

{
  char cVar1;
  int iVar2;
  int pos1;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pos1 = flagind;
  flagarg = (char *)0x0;
  uVar5 = (ulong)flagind;
  iVar8 = argc;
  if (argc < flagind) {
    iVar8 = flagind;
  }
  for (; (iVar7 = iVar8, (long)uVar5 < (long)argc && (iVar7 = (int)uVar5, *argv[uVar5] != '-'));
      uVar5 = uVar5 + 1) {
    flagind = iVar7 + 1;
  }
  if (iVar7 == argc) {
    flagind = pos1;
    flagarg = (char *)0x0;
    return -1;
  }
  pcVar4 = argv[iVar7];
  cVar1 = pcVar4[1];
  iVar6 = (int)cVar1;
  iVar8 = iVar7;
  if (iVar6 == 0x2d) {
    if (pcVar4[2] == '\0') {
      iVar6 = -1;
      goto LAB_0010f0c1;
    }
    flagflag = 0x2d;
LAB_0010f072:
    iVar2 = flagflag;
    cVar1 = pcVar4[2];
    if (cVar1 != '\0') {
      flagarg = pcVar4 + 2;
    }
    pcVar4 = strchr(flags,flagflag);
    if (pcVar4 != (char *)0x0) {
      if (cVar1 == '\0') {
        iVar6 = iVar2;
        if (pcVar4[1] == ':') {
          uVar3 = iVar7 + 1;
          iVar8 = pos1;
          iVar6 = 0x3f;
          if (uVar3 != argc) {
            flagarg = argv[(int)uVar3];
            uVar5 = (ulong)uVar3;
            iVar8 = iVar7;
            iVar6 = iVar2;
          }
        }
      }
      else {
        iVar6 = 0x3f;
        if (pcVar4[1] == ':') {
          iVar6 = iVar2;
        }
      }
      goto LAB_0010f0c1;
    }
  }
  else {
    flagflag = iVar6;
    if ((cVar1 != '\0') && (cVar1 != ':')) goto LAB_0010f072;
  }
  iVar6 = 0x3f;
LAB_0010f0c1:
  flagind = (int)uVar5 + 1;
  if (pos1 < iVar8 && iVar8 <= (int)uVar5) {
    reverse(argv,pos1,iVar8);
    reverse(argv,iVar8,flagind);
    reverse(argv,pos1,flagind);
  }
  flagind = (pos1 - iVar8) + flagind;
  return iVar6;
}

Assistant:

int getflag(int argc, char **argv, const char *flags)
{
    int argstart, flagstart, c;
    const char *flagp;

    c = -1;
    flagarg = NULL;
    argstart = flagind;
    flagstart = argc;

    /* skip over non-flags */
    while (flagind < argc && argv[flagind][0] != '-')
    {
        ++flagind;
    }
    if (flagind == argc)
    {
        /* no more args */
        flagind = argstart;
        return c;
    }
    /* we have an arg to work with */
    do
    {
        flagstart = flagind;
        if (argv[flagind][1] == '-' && argv[flagind][2] == '\0')
        {
            /* stop parsing at '--' flag */
            break;
        }
        c = flagflag = argv[flagind][1];
        if (c == ':' || c == '\0')
        {
            /* this is an illegal flag */
            c = '?';
            break;
        }
        /* flag with arg */
        if (argv[flagind][2] != '\0')
        {
            /* flag-arg in same argv[] */
            flagarg = argv[flagind] + 2;
        }
        flagp = strchr(flags, c);
        if (flagp == NULL)
        {
            /* this is an unknown flag */
            c = '?';
            break;
        }
        if (flagarg != NULL || flagp[1] != ':')
        {
            if (flagarg != NULL && flagp[1] != ':')
            {
                /* error, a simple flag with an argument */
                c = '?';
            }
            break;
        }

        /* flag-arg is in the next argv[] */
        if (flagind + 1 == argc)
        {
            /* auahh, no flag-arg */
            flagstart = argstart;
            c = '?';
            break;
        }
        flagarg = argv[++flagind];
    } while (0);
    /* skip to next arg */
    ++flagind;

    if (flagstart < flagind && argstart < flagstart)
    {
        /* we have found some args
         * we have also skipped over some non-args
         * shuffle the non-flag arg to the end of argv */
        reverse(argv, argstart, flagstart);
        reverse(argv, flagstart, flagind);
        reverse(argv, argstart, flagind);
    }
    flagind = argstart + flagind - flagstart;

    return c;
}